

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sys.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::rotate_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Sys *this)

{
  Client *client;
  unordered_map<_e0ce3516_> local_c8;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  Url local_38;
  Sys *local_18;
  Sys *this_local;
  
  client = this->client_;
  local_18 = this;
  this_local = (Sys *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"rotate",&local_79);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_58,&local_78);
  getUrl(&local_38,this,&local_58);
  local_c8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_c8._M_h._M_rehash_policy._4_4_ = 0;
  local_c8._M_h._M_rehash_policy._M_next_resize = 0;
  local_c8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c8._M_h._M_element_count = 0;
  local_c8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_c8._M_h._M_bucket_count = 0;
  local_c8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_map<$e0ce3516$>::unordered_map(&local_c8);
  HttpConsumer::put(__return_storage_ptr__,client,&local_38,&local_c8);
  std::unordered_map<$e0ce3516$>::~unordered_map(&local_c8);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_38);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::rotate() {
  return HttpConsumer::put(client_, getUrl(Path{"rotate"}), Parameters{});
}